

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotate.h
# Opt level: O1

void Gs::Details::FreeRotation<Gs::Matrix<float,4ul,4ul>,float>
               (Matrix<float,_4UL,_4UL> *mat,Vector3T<float> *axis,float *angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = cosf(*angle);
  fVar2 = sinf(*angle);
  fVar3 = 1.0 - fVar1;
  mat->m_[0] = axis->x * axis->x * fVar3 + fVar1;
  mat->m_[1] = axis->x * axis->y * fVar3 - axis->z * fVar2;
  mat->m_[2] = axis->x * axis->z * fVar3 + axis->y * fVar2;
  mat->m_[4] = axis->y * axis->x * fVar3 + axis->z * fVar2;
  mat->m_[5] = axis->y * axis->y * fVar3 + fVar1;
  mat->m_[6] = axis->y * axis->z * fVar3 - axis->x * fVar2;
  mat->m_[8] = axis->x * axis->z * fVar3 - axis->y * fVar2;
  mat->m_[9] = axis->y * axis->z * fVar3 + fVar2 * axis->x;
  mat->m_[10] = axis->z * axis->z * fVar3 + fVar1;
  return;
}

Assistant:

void FreeRotation(M& mat, const Vector3T<T>& axis, const T& angle)
{
    GS_ASSERT_MxN_MATRIX("free rotation", M, 3, 3);

    /* Setup rotation values */
    const T  c  = std::cos(angle);
    const T  s  = std::sin(angle);
    const T  cc = T(1) - c;

    const T& x  = axis.x;
    const T& y  = axis.y;
    const T& z  = axis.z;

    /* Perform matrix rotation */
    mat.At(0, 0) = x*x*cc + c;
    mat.At(1, 0) = x*y*cc - z*s;
    mat.At(2, 0) = x*z*cc + y*s;

    mat.At(0, 1) = y*x*cc + z*s;
    mat.At(1, 1) = y*y*cc + c;
    mat.At(2, 1) = y*z*cc - x*s;

    mat.At(0, 2) = x*z*cc - y*s;
    mat.At(1, 2) = y*z*cc + x*s;
    mat.At(2, 2) = z*z*cc + c;
}